

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.cpp
# Opt level: O0

void test_qclab_qgates_PointerGate1<float>(void)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  char *in_R9;
  AssertHelper local_1400;
  Message local_13f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f0;
  undefined1 local_13d0 [8];
  AssertionResult gtest_ar_33;
  Message local_13b8;
  int local_13b0;
  int local_13ac;
  undefined1 local_13a8 [8];
  AssertionResult gtest_ar_32;
  stringstream qasm_3;
  ostream local_1388 [376];
  AssertHelper local_1210;
  Message local_1208;
  QGate1<float> **local_1200;
  QGate1<float> *local_11f8;
  undefined1 local_11f0 [8];
  AssertionResult gtest_ar_31;
  Message local_11d8;
  int local_11d0;
  int local_11cc;
  undefined1 local_11c8 [8];
  AssertionResult gtest_ar_30;
  Message local_11b0;
  int local_11a4;
  vector<int,_std::allocator<int>_> local_11a0;
  undefined1 local_1188 [8];
  AssertionResult gtest_ar_29;
  Message local_1170;
  int local_1168;
  int local_1164;
  undefined1 local_1160 [8];
  AssertionResult gtest_ar_28;
  AssertHelper local_1130;
  Message local_1128;
  bool local_1119;
  undefined1 local_1118 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_10e8;
  Message local_10e0;
  bool local_10d1;
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar__15;
  Message local_10b8;
  int local_10b0;
  int local_10ac;
  undefined1 local_10a8 [8];
  AssertionResult gtest_ar_27;
  PointerGate1<float> P_3;
  PauliX<float> X_3;
  Message local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  undefined1 local_1040 [8];
  AssertionResult gtest_ar_26;
  Message local_1028;
  int local_1020;
  int local_101c;
  undefined1 local_1018 [8];
  AssertionResult gtest_ar_25;
  stringstream qasm_2;
  ostream local_ff8 [376];
  AssertHelper local_e80;
  Message local_e78;
  QGate1<float> **local_e70;
  QGate1<float> *local_e68;
  undefined1 local_e60 [8];
  AssertionResult gtest_ar_24;
  Message local_e48;
  int local_e40;
  int local_e3c;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar_23;
  Message local_e20;
  int local_e14;
  vector<int,_std::allocator<int>_> local_e10;
  undefined1 local_df8 [8];
  AssertionResult gtest_ar_22;
  Message local_de0;
  int local_dd8;
  int local_dd4;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar_21;
  AssertHelper local_da0;
  Message local_d98;
  bool local_d89;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_d58;
  Message local_d50;
  bool local_d41;
  undefined1 local_d40 [8];
  AssertionResult gtest_ar__13;
  Message local_d28;
  int local_d20;
  int local_d1c;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar_20;
  PointerGate1<float> P_2;
  PauliX<float> X_2;
  Message local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_19;
  Message local_c98;
  int local_c90;
  int local_c8c;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar_18;
  stringstream qasm_1;
  ostream local_c68 [376];
  AssertHelper local_af0;
  Message local_ae8;
  QGate1<float> **local_ae0;
  QGate1<float> *local_ad8;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_17;
  Message local_ab8;
  int local_ab0;
  int local_aac;
  undefined1 local_aa8 [8];
  AssertionResult gtest_ar_16;
  Message local_a90;
  int local_a84;
  vector<int,_std::allocator<int>_> local_a80;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_15;
  Message local_a50;
  int local_a48;
  int local_a44;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_a10;
  Message local_a08;
  bool local_9f9;
  undefined1 local_9f8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_9c8;
  Message local_9c0;
  bool local_9b1;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar__11;
  Message local_998;
  int local_990;
  int local_98c;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_13;
  PointerGate1<float> P_1;
  PauliX<float> X_1;
  AssertHelper local_930;
  Message local_928;
  bool local_919;
  undefined1 local_918 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_8e8;
  Message local_8e0;
  bool local_8d1;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_8a0;
  Message local_898;
  bool local_889;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_858;
  Message local_850;
  bool local_841;
  undefined1 local_840 [8];
  AssertionResult gtest_ar__7;
  PointerGate1<float> PZ;
  PointerGate1<float> PX;
  PauliX<float> X2;
  AssertHelper local_7d0;
  Message local_7c8;
  bool local_7b9;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_788;
  Message local_780;
  bool local_771;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__5;
  PauliZ<float> Z;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_6e8;
  Message local_6e0;
  bool local_6d1;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar__3;
  Message local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_12;
  Message local_678;
  int local_670;
  int local_66c;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_11;
  stringstream qasm2;
  ostream local_648 [376];
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  vector<int,_std::allocator<int>_> local_4b8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_10;
  Message local_488;
  int local_480;
  int local_47c;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_9;
  Message local_460;
  int local_458;
  int local_454;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_8;
  Message local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_7;
  Message local_3f8;
  int local_3f0;
  int local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_6;
  stringstream qasm;
  ostream local_3c8 [376];
  string local_250;
  AssertHelper local_230;
  Message local_228;
  SquareMatrix<float> local_220;
  undefined1 local_210 [23];
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__2;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  int local_1ac;
  size_type local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  vector<int,_std::allocator<int>_> qubits;
  Message local_170;
  QGate1<float> **local_168;
  QGate1<float> *local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  int local_138;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  int local_110;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  Message local_60;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  PointerGate1<float> P;
  PauliX<float> X;
  
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&P.gate_);
  qclab::qgates::PointerGate1<float>::PointerGate1
            ((PointerGate1<float> *)local_30,(QGate1<float> *)&P.gate_,0);
  local_54 = qclab::qgates::QGate1<float>::nbQubits((QGate1<float> *)local_30);
  local_58 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_50,"P.nbQubits()","1",&local_54,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_79 = qclab::qgates::PointerGate1<float>::fixed((PointerGate1<float> *)local_30);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_78,(AssertionResult *)"P.fixed()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  bVar1 = qclab::qgates::QGate1<float>::controlled((QGate1<float> *)local_30);
  local_c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_c0,
               (AssertionResult *)"P.controlled()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_10c = qclab::qgates::PointerGate1<float>::qubit((PointerGate1<float> *)local_30);
  local_110 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_108,"P.qubit()","0",&local_10c,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_134 = qclab::qgates::PointerGate1<float>::offset((PointerGate1<float> *)local_30);
  local_138 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_130,"P.offset()","0",&local_134,&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_160 = qclab::qgates::PointerGate1<float>::ptr((PointerGate1<float> *)local_30);
  local_168 = &P.gate_;
  testing::internal::EqHelper::
  Compare<qclab::qgates::QGate1<float>_*,_qclab::qgates::PauliX<float>_*,_nullptr>
            ((EqHelper *)local_158,"P.ptr()","&X",&local_160,(PauliX<float> **)&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_170);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  qclab::qgates::PointerGate1<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_4.message_,
             (PointerGate1<float> *)local_30);
  local_1a8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_4.message_);
  local_1ac = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1a0,"qubits.size()","1",&local_1a8,&local_1ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_4.message_,0);
  local_1d4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d0,"qubits[0]","0",pvVar3,&local_1d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  qclab::qgates::PointerGate1<float>::matrix((PointerGate1<float> *)local_210);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_220);
  local_1f9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)local_210,&local_220);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_220);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)local_1f8,(AssertionResult *)"P.matrix() == X.matrix()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_6.message_);
  local_3ec = qclab::qgates::PointerGate1<float>::toQASM
                        ((PointerGate1<float> *)local_30,local_3c8,0);
  local_3f0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3e8,"P.toQASM( qasm )","0",&local_3ec,&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_410,"qasm.str()","\"x q[0];\\n\"",&local_430,(char (*) [9])0x6687d8);
  std::__cxx11::string::~string((string *)&local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  qclab::qgates::PointerGate1<float>::setOffset((PointerGate1<float> *)local_30,3);
  local_454 = qclab::qgates::PointerGate1<float>::offset((PointerGate1<float> *)local_30);
  local_458 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_450,"P.offset()","3",&local_454,&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  local_47c = qclab::qgates::PointerGate1<float>::qubit((PointerGate1<float> *)local_30);
  local_480 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_478,"P.qubit()","3",&local_47c,&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  qclab::qgates::PointerGate1<float>::qubits(&local_4b8,(PointerGate1<float> *)local_30);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_4b8,0);
  local_4bc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_4a0,"P.qubits()[0]","3",pvVar3,&local_4bc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_11.message_);
  local_66c = qclab::qgates::PointerGate1<float>::toQASM
                        ((PointerGate1<float> *)local_30,local_648,0);
  local_670 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_668,"P.toQASM( qasm2 )","0",&local_66c,&local_670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_690,"qasm2.str()","\"x q[3];\\n\"",&local_6b0,
             (char (*) [9])"x q[3];\n");
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  local_6d1 = qclab::QObject<float>::operator==
                        ((QObject<float> *)local_30,(QObject<float> *)&P.gate_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d0,&local_6d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_6d0,(AssertionResult *)"P == X",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  bVar1 = qclab::QObject<float>::operator!=((QObject<float> *)local_30,(QObject<float> *)&P.gate_);
  local_719 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Z.super_QGate1<float>.qubit_,(internal *)local_718,
               (AssertionResult *)"P != X","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&Z.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  qclab::qgates::PauliZ<float>::PauliZ((PauliZ<float> *)&gtest_ar__5.message_);
  local_771 = qclab::QObject<float>::operator!=
                        ((QObject<float> *)local_30,(QObject<float> *)&gtest_ar__5.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_770,&local_771,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_770,(AssertionResult *)"P != Z",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  bVar1 = qclab::QObject<float>::operator==
                    ((QObject<float> *)local_30,(QObject<float> *)&gtest_ar__5.message_);
  local_7b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b8,&local_7b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X2.super_QGate1<float>.qubit_,(internal *)local_7b8,
               (AssertionResult *)"P == Z","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    std::__cxx11::string::~string((string *)&X2.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&PX.gate_);
  qclab::qgates::PointerGate1<float>::PointerGate1
            ((PointerGate1<float> *)&PZ.gate_,(QGate1<float> *)&PX.gate_,0);
  qclab::qgates::PointerGate1<float>::PointerGate1
            ((PointerGate1<float> *)&gtest_ar__7.message_,(QGate1<float> *)&gtest_ar__5.message_,0);
  local_841 = qclab::QObject<float>::operator==
                        ((QObject<float> *)local_30,(QObject<float> *)&PZ.gate_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_840,&local_841,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_840,(AssertionResult *)"P == PX",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_858,&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  bVar1 = qclab::QObject<float>::operator!=((QObject<float> *)local_30,(QObject<float> *)&PZ.gate_);
  local_889 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_888,&local_889,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_888,(AssertionResult *)"P != PX",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  local_8d1 = qclab::QObject<float>::operator!=
                        ((QObject<float> *)local_30,(QObject<float> *)&gtest_ar__7.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8d0,&local_8d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_8e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_8d0,(AssertionResult *)"P != PZ",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e8,&local_8e0);
    testing::internal::AssertHelper::~AssertHelper(&local_8e8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  bVar1 = qclab::QObject<float>::operator==
                    ((QObject<float> *)local_30,(QObject<float> *)&gtest_ar__7.message_);
  local_919 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_918,&local_919,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
  if (!bVar1) {
    testing::Message::Message(&local_928);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_1.super_QGate1<float>.qubit_,(internal *)local_918,
               (AssertionResult *)"P == PZ","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_930,&local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    std::__cxx11::string::~string((string *)&X_1.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
  qclab::qgates::PointerGate1<float>::~PointerGate1((PointerGate1<float> *)&gtest_ar__7.message_);
  qclab::qgates::PointerGate1<float>::~PointerGate1((PointerGate1<float> *)&PZ.gate_);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&PX.gate_);
  qclab::qgates::PauliZ<float>::~PauliZ((PauliZ<float> *)&gtest_ar__5.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_11.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_6.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_4.message_);
  qclab::qgates::PointerGate1<float>::~PointerGate1((PointerGate1<float> *)local_30);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&P.gate_);
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&P_1.gate_,5);
  qclab::qgates::PointerGate1<float>::PointerGate1
            ((PointerGate1<float> *)&gtest_ar_13.message_,(QGate1<float> *)&P_1.gate_,0);
  local_98c = qclab::qgates::QGate1<float>::nbQubits((QGate1<float> *)&gtest_ar_13.message_);
  local_990 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_988,"P.nbQubits()","1",&local_98c,&local_990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar1) {
    testing::Message::Message(&local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11.message_,&local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  local_9b1 = qclab::qgates::PointerGate1<float>::fixed
                        ((PointerGate1<float> *)&gtest_ar_13.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9b0,&local_9b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar1) {
    testing::Message::Message(&local_9c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_9b0,(AssertionResult *)"P.fixed()"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c8,&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_9c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  bVar1 = qclab::qgates::QGate1<float>::controlled((QGate1<float> *)&gtest_ar_13.message_);
  local_9f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9f8,&local_9f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
  if (!bVar1) {
    testing::Message::Message(&local_a08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_14.message_,(internal *)local_9f8,
               (AssertionResult *)"P.controlled()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a10,&local_a08);
    testing::internal::AssertHelper::~AssertHelper(&local_a10);
    std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
  local_a44 = qclab::qgates::PointerGate1<float>::qubit
                        ((PointerGate1<float> *)&gtest_ar_13.message_);
  local_a48 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a40,"P.qubit()","5",&local_a44,&local_a48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  qclab::qgates::PointerGate1<float>::qubits
            (&local_a80,(PointerGate1<float> *)&gtest_ar_13.message_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_a80,0);
  local_a84 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a68,"P.qubits()[0]","5",pvVar3,&local_a84);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    testing::Message::Message(&local_a90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_a90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  local_aac = qclab::qgates::PointerGate1<float>::offset
                        ((PointerGate1<float> *)&gtest_ar_13.message_);
  local_ab0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_aa8,"P.offset()","0",&local_aac,&local_ab0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa8);
  if (!bVar1) {
    testing::Message::Message(&local_ab8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_aa8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_ab8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa8);
  local_ad8 = qclab::qgates::PointerGate1<float>::ptr((PointerGate1<float> *)&gtest_ar_13.message_);
  local_ae0 = &P_1.gate_;
  testing::internal::EqHelper::
  Compare<qclab::qgates::QGate1<float>_*,_qclab::qgates::PauliX<float>_*,_nullptr>
            ((EqHelper *)local_ad0,"P.ptr()","&X",&local_ad8,(PauliX<float> **)&local_ae0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar1) {
    testing::Message::Message(&local_ae8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
    testing::internal::AssertHelper::AssertHelper
              (&local_af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_af0,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_af0);
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_18.message_);
  local_c8c = qclab::qgates::PointerGate1<float>::toQASM
                        ((PointerGate1<float> *)&gtest_ar_13.message_,local_c68,0);
  local_c90 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c88,"P.toQASM( qasm )","0",&local_c8c,&local_c90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c88);
  if (!bVar1) {
    testing::Message::Message(&local_c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_cb0,"qasm.str()","\"x q[5];\\n\"",&local_cd0,
             (char (*) [9])"x q[5];\n");
  std::__cxx11::string::~string((string *)&local_cd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar1) {
    testing::Message::Message(&local_cd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X_2.super_QGate1<float>.qubit_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&X_2.super_QGate1<float>.qubit_,&local_cd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X_2.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_cd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_18.message_);
  qclab::qgates::PointerGate1<float>::~PointerGate1((PointerGate1<float> *)&gtest_ar_13.message_);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&P_1.gate_);
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&P_2.gate_);
  qclab::qgates::PointerGate1<float>::PointerGate1
            ((PointerGate1<float> *)&gtest_ar_20.message_,(QGate1<float> *)&P_2.gate_,3);
  local_d1c = qclab::qgates::QGate1<float>::nbQubits((QGate1<float> *)&gtest_ar_20.message_);
  local_d20 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d18,"P.nbQubits()","1",&local_d1c,&local_d20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d18);
  if (!bVar1) {
    testing::Message::Message(&local_d28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__13.message_,&local_d28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
  local_d41 = qclab::qgates::PointerGate1<float>::fixed
                        ((PointerGate1<float> *)&gtest_ar_20.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d40,&local_d41,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d40);
  if (!bVar1) {
    testing::Message::Message(&local_d50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_d40,(AssertionResult *)"P.fixed()"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_d50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d40);
  bVar1 = qclab::qgates::QGate1<float>::controlled((QGate1<float> *)&gtest_ar_20.message_);
  local_d89 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d88,&local_d89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
  if (!bVar1) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_21.message_,(internal *)local_d88,
               (AssertionResult *)"P.controlled()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
  local_dd4 = qclab::qgates::PointerGate1<float>::qubit
                        ((PointerGate1<float> *)&gtest_ar_20.message_);
  local_dd8 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_dd0,"P.qubit()","3",&local_dd4,&local_dd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar1) {
    testing::Message::Message(&local_de0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_de0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_de0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  qclab::qgates::PointerGate1<float>::qubits
            (&local_e10,(PointerGate1<float> *)&gtest_ar_20.message_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_e10,0);
  local_e14 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_df8,"P.qubits()[0]","3",pvVar3,&local_e14);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df8);
  if (!bVar1) {
    testing::Message::Message(&local_e20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_df8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_e20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_df8);
  local_e3c = qclab::qgates::PointerGate1<float>::offset
                        ((PointerGate1<float> *)&gtest_ar_20.message_);
  local_e40 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e38,"P.offset()","3",&local_e3c,&local_e40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e38);
  if (!bVar1) {
    testing::Message::Message(&local_e48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_e48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_e48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e38);
  local_e68 = qclab::qgates::PointerGate1<float>::ptr((PointerGate1<float> *)&gtest_ar_20.message_);
  local_e70 = &P_2.gate_;
  testing::internal::EqHelper::
  Compare<qclab::qgates::QGate1<float>_*,_qclab::qgates::PauliX<float>_*,_nullptr>
            ((EqHelper *)local_e60,"P.ptr()","&X",&local_e68,(PauliX<float> **)&local_e70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e60);
  if (!bVar1) {
    testing::Message::Message(&local_e78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e60);
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    testing::Message::~Message(&local_e78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e60);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_25.message_);
  local_101c = qclab::qgates::PointerGate1<float>::toQASM
                         ((PointerGate1<float> *)&gtest_ar_20.message_,local_ff8,0);
  local_1020 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1018,"P.toQASM( qasm )","0",&local_101c,&local_1020);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1018);
  if (!bVar1) {
    testing::Message::Message(&local_1028);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1018);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_1028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1018);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_1040,"qasm.str()","\"x q[3];\\n\"",&local_1060,
             (char (*) [9])"x q[3];\n");
  std::__cxx11::string::~string((string *)&local_1060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1040);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1040);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X_3.super_QGate1<float>.qubit_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&X_3.super_QGate1<float>.qubit_,&local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X_3.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1040);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_25.message_);
  qclab::qgates::PointerGate1<float>::~PointerGate1((PointerGate1<float> *)&gtest_ar_20.message_);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&P_2.gate_);
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&P_3.gate_,4);
  qclab::qgates::PointerGate1<float>::PointerGate1
            ((PointerGate1<float> *)&gtest_ar_27.message_,(QGate1<float> *)&P_3.gate_,3);
  local_10ac = qclab::qgates::QGate1<float>::nbQubits((QGate1<float> *)&gtest_ar_27.message_);
  local_10b0 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_10a8,"P.nbQubits()","1",&local_10ac,&local_10b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10a8);
  if (!bVar1) {
    testing::Message::Message(&local_10b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__15.message_,&local_10b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_10b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10a8);
  local_10d1 = qclab::qgates::PointerGate1<float>::fixed
                         ((PointerGate1<float> *)&gtest_ar_27.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10d0,&local_10d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d0);
  if (!bVar1) {
    testing::Message::Message(&local_10e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_10d0,
               (AssertionResult *)"P.fixed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_10e8,&local_10e0);
    testing::internal::AssertHelper::~AssertHelper(&local_10e8);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_10e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d0);
  bVar1 = qclab::qgates::QGate1<float>::controlled((QGate1<float> *)&gtest_ar_27.message_);
  local_1119 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1118,&local_1119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1118);
  if (!bVar1) {
    testing::Message::Message(&local_1128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_28.message_,(internal *)local_1118,
               (AssertionResult *)"P.controlled()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1130,&local_1128);
    testing::internal::AssertHelper::~AssertHelper(&local_1130);
    std::__cxx11::string::~string((string *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_1128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1118);
  local_1164 = qclab::qgates::PointerGate1<float>::qubit
                         ((PointerGate1<float> *)&gtest_ar_27.message_);
  local_1168 = 7;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1160,"P.qubit()","7",&local_1164,&local_1168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1160);
  if (!bVar1) {
    testing::Message::Message(&local_1170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_1170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_1170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1160);
  qclab::qgates::PointerGate1<float>::qubits
            (&local_11a0,(PointerGate1<float> *)&gtest_ar_27.message_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_11a0,0);
  local_11a4 = 7;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1188,"P.qubits()[0]","7",pvVar3,&local_11a4);
  std::vector<int,_std::allocator<int>_>::~vector(&local_11a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1188);
  if (!bVar1) {
    testing::Message::Message(&local_11b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_11b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_11b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1188);
  local_11cc = qclab::qgates::PointerGate1<float>::offset
                         ((PointerGate1<float> *)&gtest_ar_27.message_);
  local_11d0 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_11c8,"P.offset()","3",&local_11cc,&local_11d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11c8);
  if (!bVar1) {
    testing::Message::Message(&local_11d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_11d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_11d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11c8);
  local_11f8 = qclab::qgates::PointerGate1<float>::ptr((PointerGate1<float> *)&gtest_ar_27.message_)
  ;
  local_1200 = &P_3.gate_;
  testing::internal::EqHelper::
  Compare<qclab::qgates::QGate1<float>_*,_qclab::qgates::PauliX<float>_*,_nullptr>
            ((EqHelper *)local_11f0,"P.ptr()","&X",&local_11f8,(PauliX<float> **)&local_1200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f0);
  if (!bVar1) {
    testing::Message::Message(&local_1208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1210,&local_1208);
    testing::internal::AssertHelper::~AssertHelper(&local_1210);
    testing::Message::~Message(&local_1208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f0);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_32.message_);
  local_13ac = qclab::qgates::PointerGate1<float>::toQASM
                         ((PointerGate1<float> *)&gtest_ar_27.message_,local_1388,0);
  local_13b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_13a8,"P.toQASM( qasm )","0",&local_13ac,&local_13b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13a8);
  if (!bVar1) {
    testing::Message::Message(&local_13b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_13b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13a8);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_13d0,"qasm.str()","\"x q[7];\\n\"",&local_13f0,
             (char (*) [9])"x q[7];\n");
  std::__cxx11::string::~string((string *)&local_13f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13d0);
  if (!bVar1) {
    testing::Message::Message(&local_13f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1400,&local_13f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1400);
    testing::Message::~Message(&local_13f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_32.message_);
  qclab::qgates::PointerGate1<float>::~PointerGate1((PointerGate1<float> *)&gtest_ar_27.message_);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&P_3.gate_);
  return;
}

Assistant:

void test_qclab_qgates_PointerGate1() {

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 0 ) ;      // qubit
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // qubits
    auto qubits = P.qubits() ;
    EXPECT_EQ( qubits.size() , 1 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;

    // matrix
    EXPECT_TRUE( P.matrix() == X.matrix() ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\n" ) ;

    // setOffset
    P.setOffset( 3 ) ;
    EXPECT_EQ( P.offset() , 3 ) ;
    EXPECT_EQ( P.qubit() , 3 ) ;
    EXPECT_EQ( P.qubits()[0] , 3 ) ;
    std::stringstream qasm2 ;
    EXPECT_EQ( P.toQASM( qasm2 ) , 0 ) ;
    EXPECT_EQ( qasm2.str() , "x q[3];\n" ) ;

    // operators == and !=
    EXPECT_TRUE(  P == X ) ;
    EXPECT_FALSE( P != X ) ;
    qclab::qgates::PauliZ< T >  Z ;
    EXPECT_TRUE(  P != Z ) ;
    EXPECT_FALSE( P == Z ) ;
    qclab::qgates::PauliX< T >  X2 ;
    qclab::qgates::PointerGate1< T > PX( &X2 ) ;
    qclab::qgates::PointerGate1< T > PZ( &Z ) ;
    EXPECT_TRUE(  P == PX ) ;
    EXPECT_FALSE( P != PX ) ;
    EXPECT_TRUE(  P != PZ ) ;
    EXPECT_FALSE( P == PZ ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 5 ) ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 5 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 5 ) ;  // qubits
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[5];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 3 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 3 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[3];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 4 ) ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 7 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 7 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[7];\n" ) ;
  }

}